

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<4,_16777232,_false,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  long lVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  AABBNodeMB4D *node1;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  undefined4 uVar37;
  ulong unaff_RBX;
  size_t mask;
  ulong uVar38;
  size_t sVar39;
  ulong uVar40;
  long lVar41;
  ulong uVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar50;
  float fVar62;
  float fVar63;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar64;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar86;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar94;
  float fVar98;
  float fVar99;
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar100;
  undefined1 auVar97 [16];
  uint uVar101;
  uint uVar103;
  uint uVar104;
  undefined1 auVar102 [16];
  uint uVar105;
  undefined1 auVar106 [16];
  float fVar107;
  float fVar110;
  float fVar111;
  float fVar112;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 local_a48 [16];
  int local_a2c;
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  RTCIntersectArguments *local_9f0;
  ulong local_9e8;
  ulong local_9e0;
  Scene *local_9d8;
  undefined8 uStack_9d0;
  ulong local_9c0;
  ulong local_9b8;
  ulong local_9b0;
  ulong local_9a8;
  ulong local_9a0;
  NodeRef *local_998;
  RayQueryContext *local_990;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  
  auVar33 = mm_lookupmask_ps._240_16_;
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar50 = ray->tfar;
    if (0.0 <= fVar50) {
      local_998 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar5 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar3 = (ray->dir).field_0;
      auVar83._8_4_ = 0x7fffffff;
      auVar83._0_8_ = 0x7fffffff7fffffff;
      auVar83._12_4_ = 0x7fffffff;
      auVar83 = vandps_avx((undefined1  [16])aVar3,auVar83);
      auVar45._8_4_ = 0x219392ef;
      auVar45._0_8_ = 0x219392ef219392ef;
      auVar45._12_4_ = 0x219392ef;
      auVar83 = vcmpps_avx(auVar83,auVar45,1);
      auVar83 = vblendvps_avx((undefined1  [16])aVar3,auVar45,auVar83);
      auVar45 = vrcpps_avx(auVar83);
      fVar62 = auVar45._0_4_;
      auVar75._0_4_ = fVar62 * auVar83._0_4_;
      fVar63 = auVar45._4_4_;
      auVar75._4_4_ = fVar63 * auVar83._4_4_;
      fVar64 = auVar45._8_4_;
      auVar75._8_4_ = fVar64 * auVar83._8_4_;
      fVar86 = auVar45._12_4_;
      auVar75._12_4_ = fVar86 * auVar83._12_4_;
      auVar87._8_4_ = 0x3f800000;
      auVar87._0_8_ = &DAT_3f8000003f800000;
      auVar87._12_4_ = 0x3f800000;
      auVar83 = vsubps_avx(auVar87,auVar75);
      auVar76._0_4_ = fVar62 + fVar62 * auVar83._0_4_;
      auVar76._4_4_ = fVar63 + fVar63 * auVar83._4_4_;
      auVar76._8_4_ = fVar64 + fVar64 * auVar83._8_4_;
      auVar76._12_4_ = fVar86 + fVar86 * auVar83._12_4_;
      uVar37 = *(undefined4 *)&(ray->org).field_0;
      auVar89._4_4_ = uVar37;
      auVar89._0_4_ = uVar37;
      auVar89._8_4_ = uVar37;
      auVar89._12_4_ = uVar37;
      uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      auVar91._4_4_ = uVar37;
      auVar91._0_4_ = uVar37;
      auVar91._8_4_ = uVar37;
      auVar91._12_4_ = uVar37;
      uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar95._4_4_ = uVar37;
      auVar95._0_4_ = uVar37;
      auVar95._8_4_ = uVar37;
      auVar95._12_4_ = uVar37;
      auVar75 = vshufps_avx(auVar76,auVar76,0);
      auVar83 = vmovshdup_avx(auVar76);
      auVar87 = vshufps_avx(auVar76,auVar76,0x55);
      auVar45 = vshufpd_avx(auVar76,auVar76,1);
      local_9a0 = (ulong)(auVar76._0_4_ < 0.0) << 4;
      auVar76 = vshufps_avx(auVar76,auVar76,0xaa);
      local_9a8 = (ulong)(auVar83._0_4_ < 0.0) << 4 | 0x20;
      local_9b0 = (ulong)(auVar45._0_4_ < 0.0) << 4 | 0x40;
      local_9b8 = local_9a0 ^ 0x10;
      uVar42 = local_9a8 ^ 0x10;
      uVar40 = local_9b0 ^ 0x10;
      auVar83 = vshufps_avx(auVar5,auVar5,0);
      auVar5 = vshufps_avx(ZEXT416((uint)fVar50),ZEXT416((uint)fVar50),0);
      local_990 = context;
      local_9e8 = uVar40;
      local_9e0 = uVar42;
      do {
        if (local_998 == stack) {
          return;
        }
        sVar39 = local_998[-1].ptr;
        local_998 = local_998 + -1;
        do {
          if ((sVar39 & 8) == 0) {
            uVar34 = sVar39 & 0xfffffffffffffff0;
            fVar50 = (ray->dir).field_0.m128[3];
            auVar44._4_4_ = fVar50;
            auVar44._0_4_ = fVar50;
            auVar44._8_4_ = fVar50;
            auVar44._12_4_ = fVar50;
            pfVar2 = (float *)(uVar34 + 0x80 + local_9a0);
            pfVar1 = (float *)(uVar34 + 0x20 + local_9a0);
            auVar51._0_4_ = fVar50 * *pfVar2 + *pfVar1;
            auVar51._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
            auVar51._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar51._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar45 = vsubps_avx(auVar51,auVar89);
            auVar52._0_4_ = auVar75._0_4_ * auVar45._0_4_;
            auVar52._4_4_ = auVar75._4_4_ * auVar45._4_4_;
            auVar52._8_4_ = auVar75._8_4_ * auVar45._8_4_;
            auVar52._12_4_ = auVar75._12_4_ * auVar45._12_4_;
            auVar45 = vmaxps_avx(auVar83,auVar52);
            pfVar2 = (float *)(uVar34 + 0x80 + local_9a8);
            pfVar1 = (float *)(uVar34 + 0x20 + local_9a8);
            auVar65._0_4_ = fVar50 * *pfVar2 + *pfVar1;
            auVar65._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
            auVar65._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar65._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar51 = vsubps_avx(auVar65,auVar91);
            auVar66._0_4_ = auVar87._0_4_ * auVar51._0_4_;
            auVar66._4_4_ = auVar87._4_4_ * auVar51._4_4_;
            auVar66._8_4_ = auVar87._8_4_ * auVar51._8_4_;
            auVar66._12_4_ = auVar87._12_4_ * auVar51._12_4_;
            pfVar2 = (float *)(uVar34 + 0x80 + local_9b0);
            pfVar1 = (float *)(uVar34 + 0x20 + local_9b0);
            auVar77._0_4_ = fVar50 * *pfVar2 + *pfVar1;
            auVar77._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
            auVar77._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar77._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar51 = vsubps_avx(auVar77,auVar95);
            auVar78._0_4_ = auVar76._0_4_ * auVar51._0_4_;
            auVar78._4_4_ = auVar76._4_4_ * auVar51._4_4_;
            auVar78._8_4_ = auVar76._8_4_ * auVar51._8_4_;
            auVar78._12_4_ = auVar76._12_4_ * auVar51._12_4_;
            auVar51 = vmaxps_avx(auVar66,auVar78);
            auVar45 = vmaxps_avx(auVar45,auVar51);
            pfVar2 = (float *)(uVar34 + 0x80 + local_9b8);
            pfVar1 = (float *)(uVar34 + 0x20 + local_9b8);
            auVar67._0_4_ = fVar50 * *pfVar2 + *pfVar1;
            auVar67._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
            auVar67._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar67._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar51 = vsubps_avx(auVar67,auVar89);
            auVar68._0_4_ = auVar75._0_4_ * auVar51._0_4_;
            auVar68._4_4_ = auVar75._4_4_ * auVar51._4_4_;
            auVar68._8_4_ = auVar75._8_4_ * auVar51._8_4_;
            auVar68._12_4_ = auVar75._12_4_ * auVar51._12_4_;
            pfVar2 = (float *)(uVar34 + 0x80 + uVar42);
            auVar51 = vminps_avx(auVar5,auVar68);
            pfVar1 = (float *)(uVar34 + 0x20 + uVar42);
            auVar79._0_4_ = fVar50 * *pfVar2 + *pfVar1;
            auVar79._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
            auVar79._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar79._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar52 = vsubps_avx(auVar79,auVar91);
            pfVar2 = (float *)(uVar34 + 0x80 + uVar40);
            pfVar1 = (float *)(uVar34 + 0x20 + uVar40);
            auVar84._0_4_ = fVar50 * *pfVar2 + *pfVar1;
            auVar84._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
            auVar84._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
            auVar84._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
            auVar80._0_4_ = auVar87._0_4_ * auVar52._0_4_;
            auVar80._4_4_ = auVar87._4_4_ * auVar52._4_4_;
            auVar80._8_4_ = auVar87._8_4_ * auVar52._8_4_;
            auVar80._12_4_ = auVar87._12_4_ * auVar52._12_4_;
            auVar52 = vsubps_avx(auVar84,auVar95);
            auVar85._0_4_ = auVar76._0_4_ * auVar52._0_4_;
            auVar85._4_4_ = auVar76._4_4_ * auVar52._4_4_;
            auVar85._8_4_ = auVar76._8_4_ * auVar52._8_4_;
            auVar85._12_4_ = auVar76._12_4_ * auVar52._12_4_;
            auVar52 = vminps_avx(auVar80,auVar85);
            auVar51 = vminps_avx(auVar51,auVar52);
            if (((uint)sVar39 & 7) == 6) {
              auVar51 = vcmpps_avx(auVar45,auVar51,2);
              auVar45 = vcmpps_avx(*(undefined1 (*) [16])(uVar34 + 0xe0),auVar44,2);
              auVar52 = vcmpps_avx(auVar44,*(undefined1 (*) [16])(uVar34 + 0xf0),1);
              auVar45 = vandps_avx(auVar45,auVar52);
              auVar45 = vandps_avx(auVar45,auVar51);
            }
            else {
              auVar45 = vcmpps_avx(auVar45,auVar51,2);
            }
            auVar45 = vpslld_avx(auVar45,0x1f);
            uVar37 = vmovmskps_avx(auVar45);
            unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar37);
          }
          if ((sVar39 & 8) == 0) {
            if (unaff_RBX == 0) {
              iVar36 = 4;
            }
            else {
              uVar34 = sVar39 & 0xfffffffffffffff0;
              lVar41 = 0;
              if (unaff_RBX != 0) {
                for (; (unaff_RBX >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                }
              }
              iVar36 = 0;
              sVar39 = *(size_t *)(uVar34 + lVar41 * 8);
              uVar38 = unaff_RBX - 1 & unaff_RBX;
              if (uVar38 != 0) {
                local_998->ptr = sVar39;
                lVar41 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                  }
                }
                uVar35 = uVar38 - 1;
                while( true ) {
                  local_998 = local_998 + 1;
                  sVar39 = *(size_t *)(uVar34 + lVar41 * 8);
                  uVar35 = uVar35 & uVar38;
                  if (uVar35 == 0) break;
                  local_998->ptr = sVar39;
                  lVar41 = 0;
                  if (uVar35 != 0) {
                    for (; (uVar35 >> lVar41 & 1) == 0; lVar41 = lVar41 + 1) {
                    }
                  }
                  uVar38 = uVar35 - 1;
                }
                iVar36 = 0;
              }
            }
          }
          else {
            iVar36 = 6;
          }
        } while (iVar36 == 0);
        if (iVar36 == 6) {
          local_9c0 = (ulong)((uint)sVar39 & 0xf) - 8;
          bVar43 = local_9c0 != 0;
          if (bVar43) {
            uVar34 = sVar39 & 0xfffffffffffffff0;
            uVar38 = 0;
            do {
              lVar41 = uVar38 * 0x140;
              fVar50 = (ray->dir).field_0.m128[3];
              pfVar2 = (float *)(uVar34 + 0x90 + lVar41);
              pfVar1 = (float *)(uVar34 + lVar41);
              auVar92._0_4_ = fVar50 * *pfVar2 + *pfVar1;
              auVar92._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
              auVar92._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
              auVar92._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar34 + 0xa0 + lVar41);
              pfVar1 = (float *)(uVar34 + 0x10 + lVar41);
              auVar88._0_4_ = fVar50 * *pfVar2 + *pfVar1;
              auVar88._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
              auVar88._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
              auVar88._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar34 + 0xb0 + lVar41);
              pfVar1 = (float *)(uVar34 + 0x20 + lVar41);
              auVar90._0_4_ = fVar50 * *pfVar2 + *pfVar1;
              auVar90._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
              auVar90._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
              auVar90._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar34 + 0xc0 + lVar41);
              pfVar1 = (float *)(uVar34 + 0x30 + lVar41);
              auVar53._0_4_ = fVar50 * *pfVar2 + *pfVar1;
              auVar53._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
              auVar53._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
              auVar53._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar34 + 0xd0 + lVar41);
              pfVar1 = (float *)(uVar34 + 0x40 + lVar41);
              auVar69._0_4_ = fVar50 * *pfVar2 + *pfVar1;
              auVar69._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
              auVar69._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
              auVar69._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar34 + 0xe0 + lVar41);
              pfVar1 = (float *)(uVar34 + 0x50 + lVar41);
              auVar96._0_4_ = fVar50 * *pfVar2 + *pfVar1;
              auVar96._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
              auVar96._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
              auVar96._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar34 + 0xf0 + lVar41);
              pfVar1 = (float *)(uVar34 + 0x60 + lVar41);
              auVar102._0_4_ = fVar50 * *pfVar2 + *pfVar1;
              auVar102._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
              auVar102._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
              auVar102._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
              pfVar2 = (float *)(uVar34 + 0x100 + lVar41);
              pfVar1 = (float *)(uVar34 + 0x70 + lVar41);
              auVar106._0_4_ = fVar50 * *pfVar2 + *pfVar1;
              auVar106._4_4_ = fVar50 * pfVar2[1] + pfVar1[1];
              auVar106._8_4_ = fVar50 * pfVar2[2] + pfVar1[2];
              auVar106._12_4_ = fVar50 * pfVar2[3] + pfVar1[3];
              pfVar1 = (float *)(uVar34 + 0x110 + lVar41);
              pfVar2 = (float *)(uVar34 + 0x80 + lVar41);
              auVar46._0_4_ = fVar50 * *pfVar1 + *pfVar2;
              auVar46._4_4_ = fVar50 * pfVar1[1] + pfVar2[1];
              auVar46._8_4_ = fVar50 * pfVar1[2] + pfVar2[2];
              auVar46._12_4_ = fVar50 * pfVar1[3] + pfVar2[3];
              local_a48 = vsubps_avx(auVar92,auVar53);
              local_a08 = vsubps_avx(auVar88,auVar69);
              auVar45 = vsubps_avx(auVar90,auVar96);
              auVar51 = vsubps_avx(auVar102,auVar92);
              auVar52 = vsubps_avx(auVar106,auVar88);
              auVar44 = vsubps_avx(auVar46,auVar90);
              fVar64 = auVar44._0_4_;
              fVar107 = local_a08._0_4_;
              auVar47._0_4_ = fVar107 * fVar64;
              fVar11 = auVar44._4_4_;
              fVar110 = local_a08._4_4_;
              auVar47._4_4_ = fVar110 * fVar11;
              fVar18 = auVar44._8_4_;
              fVar111 = local_a08._8_4_;
              auVar47._8_4_ = fVar111 * fVar18;
              fVar25 = auVar44._12_4_;
              fVar112 = local_a08._12_4_;
              auVar47._12_4_ = fVar112 * fVar25;
              fVar86 = auVar52._0_4_;
              fVar94 = auVar45._0_4_;
              auVar54._0_4_ = fVar94 * fVar86;
              fVar12 = auVar52._4_4_;
              fVar98 = auVar45._4_4_;
              auVar54._4_4_ = fVar98 * fVar12;
              fVar19 = auVar52._8_4_;
              fVar99 = auVar45._8_4_;
              auVar54._8_4_ = fVar99 * fVar19;
              fVar26 = auVar52._12_4_;
              fVar100 = auVar45._12_4_;
              auVar54._12_4_ = fVar100 * fVar26;
              local_a18 = vsubps_avx(auVar54,auVar47);
              fVar6 = auVar51._0_4_;
              auVar55._0_4_ = fVar94 * fVar6;
              fVar13 = auVar51._4_4_;
              auVar55._4_4_ = fVar98 * fVar13;
              fVar20 = auVar51._8_4_;
              auVar55._8_4_ = fVar99 * fVar20;
              fVar27 = auVar51._12_4_;
              auVar55._12_4_ = fVar100 * fVar27;
              fVar7 = local_a48._0_4_;
              auVar70._0_4_ = fVar64 * fVar7;
              fVar14 = local_a48._4_4_;
              auVar70._4_4_ = fVar11 * fVar14;
              fVar21 = local_a48._8_4_;
              auVar70._8_4_ = fVar18 * fVar21;
              fVar28 = local_a48._12_4_;
              auVar70._12_4_ = fVar25 * fVar28;
              local_7f8 = vsubps_avx(auVar70,auVar55);
              auVar71._0_4_ = fVar86 * fVar7;
              auVar71._4_4_ = fVar12 * fVar14;
              auVar71._8_4_ = fVar19 * fVar21;
              auVar71._12_4_ = fVar26 * fVar28;
              auVar108._0_4_ = fVar107 * fVar6;
              auVar108._4_4_ = fVar110 * fVar13;
              auVar108._8_4_ = fVar111 * fVar20;
              auVar108._12_4_ = fVar112 * fVar27;
              auVar44 = vsubps_avx(auVar108,auVar71);
              uVar37 = *(undefined4 *)&(ray->org).field_0;
              auVar109._4_4_ = uVar37;
              auVar109._0_4_ = uVar37;
              auVar109._8_4_ = uVar37;
              auVar109._12_4_ = uVar37;
              uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
              auVar113._4_4_ = uVar37;
              auVar113._0_4_ = uVar37;
              auVar113._8_4_ = uVar37;
              auVar113._12_4_ = uVar37;
              uVar37 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
              auVar115._4_4_ = uVar37;
              auVar115._0_4_ = uVar37;
              auVar115._8_4_ = uVar37;
              auVar115._12_4_ = uVar37;
              fVar50 = (ray->dir).field_0.m128[1];
              local_a28 = vsubps_avx(auVar92,auVar109);
              fVar62 = (ray->dir).field_0.m128[2];
              auVar45 = vsubps_avx(auVar88,auVar113);
              auVar51 = vsubps_avx(auVar90,auVar115);
              fVar8 = auVar51._0_4_;
              auVar114._0_4_ = fVar50 * fVar8;
              fVar15 = auVar51._4_4_;
              auVar114._4_4_ = fVar50 * fVar15;
              fVar22 = auVar51._8_4_;
              auVar114._8_4_ = fVar50 * fVar22;
              fVar29 = auVar51._12_4_;
              auVar114._12_4_ = fVar50 * fVar29;
              fVar9 = auVar45._0_4_;
              auVar116._0_4_ = fVar62 * fVar9;
              fVar16 = auVar45._4_4_;
              auVar116._4_4_ = fVar62 * fVar16;
              fVar23 = auVar45._8_4_;
              auVar116._8_4_ = fVar62 * fVar23;
              fVar30 = auVar45._12_4_;
              auVar116._12_4_ = fVar62 * fVar30;
              auVar51 = vsubps_avx(auVar116,auVar114);
              fVar63 = (ray->dir).field_0.m128[0];
              fVar10 = local_a28._0_4_;
              auVar48._0_4_ = fVar62 * fVar10;
              fVar17 = local_a28._4_4_;
              auVar48._4_4_ = fVar62 * fVar17;
              fVar24 = local_a28._8_4_;
              auVar48._8_4_ = fVar62 * fVar24;
              fVar31 = local_a28._12_4_;
              auVar48._12_4_ = fVar62 * fVar31;
              auVar56._0_4_ = fVar63 * fVar8;
              auVar56._4_4_ = fVar63 * fVar15;
              auVar56._8_4_ = fVar63 * fVar22;
              auVar56._12_4_ = fVar63 * fVar29;
              auVar52 = vsubps_avx(auVar56,auVar48);
              auVar57._0_4_ = fVar63 * fVar9;
              auVar57._4_4_ = fVar63 * fVar16;
              auVar57._8_4_ = fVar63 * fVar23;
              auVar57._12_4_ = fVar63 * fVar30;
              auVar72._0_4_ = fVar50 * fVar10;
              auVar72._4_4_ = fVar50 * fVar17;
              auVar72._8_4_ = fVar50 * fVar24;
              auVar72._12_4_ = fVar50 * fVar31;
              auVar65 = vsubps_avx(auVar72,auVar57);
              auVar73._0_4_ =
                   fVar63 * local_a18._0_4_ + fVar50 * local_7f8._0_4_ + fVar62 * auVar44._0_4_;
              auVar73._4_4_ =
                   fVar63 * local_a18._4_4_ + fVar50 * local_7f8._4_4_ + fVar62 * auVar44._4_4_;
              auVar73._8_4_ =
                   fVar63 * local_a18._8_4_ + fVar50 * local_7f8._8_4_ + fVar62 * auVar44._8_4_;
              auVar73._12_4_ =
                   fVar63 * local_a18._12_4_ + fVar50 * local_7f8._12_4_ + fVar62 * auVar44._12_4_;
              auVar58._8_8_ = 0x8000000080000000;
              auVar58._0_8_ = 0x8000000080000000;
              auVar45 = vandps_avx(auVar73,auVar58);
              uVar101 = auVar45._0_4_;
              auVar93._0_4_ =
                   (float)(uVar101 ^
                          (uint)(fVar6 * auVar51._0_4_ +
                                fVar86 * auVar52._0_4_ + fVar64 * auVar65._0_4_));
              uVar103 = auVar45._4_4_;
              auVar93._4_4_ =
                   (float)(uVar103 ^
                          (uint)(fVar13 * auVar51._4_4_ +
                                fVar12 * auVar52._4_4_ + fVar11 * auVar65._4_4_));
              uVar104 = auVar45._8_4_;
              auVar93._8_4_ =
                   (float)(uVar104 ^
                          (uint)(fVar20 * auVar51._8_4_ +
                                fVar19 * auVar52._8_4_ + fVar18 * auVar65._8_4_));
              uVar105 = auVar45._12_4_;
              auVar93._12_4_ =
                   (float)(uVar105 ^
                          (uint)(fVar27 * auVar51._12_4_ +
                                fVar26 * auVar52._12_4_ + fVar25 * auVar65._12_4_));
              auVar97._0_4_ =
                   (float)(uVar101 ^
                          (uint)(auVar51._0_4_ * fVar7 +
                                auVar52._0_4_ * fVar107 + fVar94 * auVar65._0_4_));
              auVar97._4_4_ =
                   (float)(uVar103 ^
                          (uint)(auVar51._4_4_ * fVar14 +
                                auVar52._4_4_ * fVar110 + fVar98 * auVar65._4_4_));
              auVar97._8_4_ =
                   (float)(uVar104 ^
                          (uint)(auVar51._8_4_ * fVar21 +
                                auVar52._8_4_ * fVar111 + fVar99 * auVar65._8_4_));
              auVar97._12_4_ =
                   (float)(uVar105 ^
                          (uint)(auVar51._12_4_ * fVar28 +
                                auVar52._12_4_ * fVar112 + fVar100 * auVar65._12_4_));
              auVar52 = ZEXT416(0) << 0x20;
              auVar45 = vcmpps_avx(auVar93,auVar52,5);
              auVar51 = vcmpps_avx(auVar97,auVar52,5);
              auVar45 = vandps_avx(auVar45,auVar51);
              auVar59._8_4_ = 0x7fffffff;
              auVar59._0_8_ = 0x7fffffff7fffffff;
              auVar59._12_4_ = 0x7fffffff;
              auVar51 = vandps_avx(auVar73,auVar59);
              auVar52 = vcmpps_avx(auVar52,auVar73,4);
              auVar45 = vandps_avx(auVar45,auVar52);
              auVar60._0_4_ = auVar97._0_4_ + auVar93._0_4_;
              auVar60._4_4_ = auVar97._4_4_ + auVar93._4_4_;
              auVar60._8_4_ = auVar97._8_4_ + auVar93._8_4_;
              auVar60._12_4_ = auVar97._12_4_ + auVar93._12_4_;
              auVar52 = vcmpps_avx(auVar60,auVar51,2);
              auVar45 = vandps_avx(auVar45,auVar52);
              auVar52 = auVar33 & auVar45;
              if ((((auVar52 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar52 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar52 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar52[0xf] < '\0') {
                auVar45 = vandps_avx(auVar45,auVar33);
                auVar81._0_4_ =
                     (float)(uVar101 ^
                            (uint)(local_a18._0_4_ * fVar10 +
                                  local_7f8._0_4_ * fVar9 + fVar8 * auVar44._0_4_));
                auVar81._4_4_ =
                     (float)(uVar103 ^
                            (uint)(local_a18._4_4_ * fVar17 +
                                  local_7f8._4_4_ * fVar16 + fVar15 * auVar44._4_4_));
                auVar81._8_4_ =
                     (float)(uVar104 ^
                            (uint)(local_a18._8_4_ * fVar24 +
                                  local_7f8._8_4_ * fVar23 + fVar22 * auVar44._8_4_));
                auVar81._12_4_ =
                     (float)(uVar105 ^
                            (uint)(local_a18._12_4_ * fVar31 +
                                  local_7f8._12_4_ * fVar30 + fVar29 * auVar44._12_4_));
                fVar50 = (ray->org).field_0.m128[3];
                fVar62 = auVar51._0_4_;
                auVar49._0_4_ = fVar62 * fVar50;
                fVar63 = auVar51._4_4_;
                auVar49._4_4_ = fVar63 * fVar50;
                fVar64 = auVar51._8_4_;
                auVar49._8_4_ = fVar64 * fVar50;
                fVar86 = auVar51._12_4_;
                auVar49._12_4_ = fVar86 * fVar50;
                auVar52 = vcmpps_avx(auVar49,auVar81,1);
                fVar50 = ray->tfar;
                auVar61._0_4_ = fVar62 * fVar50;
                auVar61._4_4_ = fVar63 * fVar50;
                auVar61._8_4_ = fVar64 * fVar50;
                auVar61._12_4_ = fVar86 * fVar50;
                auVar65 = vcmpps_avx(auVar81,auVar61,2);
                auVar52 = vandps_avx(auVar65,auVar52);
                auVar65 = auVar45 & auVar52;
                if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar65[0xf] < '\0') {
                  auVar45 = vandps_avx(auVar45,auVar52);
                  local_808 = local_a18;
                  local_9d8 = auVar44._0_8_;
                  uStack_9d0 = auVar44._8_8_;
                  local_7e8 = local_9d8;
                  uStack_7e0 = uStack_9d0;
                  local_9d8 = local_990->scene;
                  auVar51 = vrcpps_avx(auVar51);
                  fVar50 = auVar51._0_4_;
                  auVar74._0_4_ = fVar62 * fVar50;
                  fVar62 = auVar51._4_4_;
                  auVar74._4_4_ = fVar63 * fVar62;
                  fVar63 = auVar51._8_4_;
                  auVar74._8_4_ = fVar64 * fVar63;
                  fVar64 = auVar51._12_4_;
                  auVar74._12_4_ = fVar86 * fVar64;
                  auVar82._8_4_ = 0x3f800000;
                  auVar82._0_8_ = &DAT_3f8000003f800000;
                  auVar82._12_4_ = 0x3f800000;
                  auVar51 = vsubps_avx(auVar82,auVar74);
                  fVar50 = fVar50 + fVar50 * auVar51._0_4_;
                  fVar62 = fVar62 + fVar62 * auVar51._4_4_;
                  fVar63 = fVar63 + fVar63 * auVar51._8_4_;
                  fVar64 = fVar64 + fVar64 * auVar51._12_4_;
                  local_818[0] = fVar50 * auVar81._0_4_;
                  local_818[1] = fVar62 * auVar81._4_4_;
                  local_818[2] = fVar63 * auVar81._8_4_;
                  local_818[3] = fVar64 * auVar81._12_4_;
                  local_838._0_4_ = fVar50 * auVar93._0_4_;
                  local_838._4_4_ = fVar62 * auVar93._4_4_;
                  local_838._8_4_ = fVar63 * auVar93._8_4_;
                  local_838._12_4_ = fVar64 * auVar93._12_4_;
                  local_828._0_4_ = fVar50 * auVar97._0_4_;
                  local_828._4_4_ = fVar62 * auVar97._4_4_;
                  local_828._8_4_ = fVar63 * auVar97._8_4_;
                  local_828._12_4_ = fVar64 * auVar97._12_4_;
                  uVar37 = vmovmskps_avx(auVar45);
                  uVar40 = CONCAT44((int)((ulong)local_990->scene >> 0x20),uVar37);
                  do {
                    local_a48._0_8_ = uVar40;
                    uVar42 = 0;
                    if (uVar40 != 0) {
                      for (; (uVar40 >> uVar42 & 1) == 0; uVar42 = uVar42 + 1) {
                      }
                    }
                    local_a18._0_8_ = uVar42;
                    h.geomID = *(uint *)(lVar41 + uVar34 + 0x120 + uVar42 * 4);
                    local_a28._0_8_ = CONCAT44(0,h.geomID);
                    lVar4 = *(long *)(*(long *)((long)local_9d8 + 0x1e8) + CONCAT44(0,h.geomID) * 8)
                    ;
                    local_a08._0_8_ = lVar4;
                    if ((*(uint *)(lVar4 + 0x34) & ray->mask) == 0) {
                      local_a48._0_8_ = uVar40 ^ 1L << (uVar42 & 0x3f);
                      bVar32 = true;
                    }
                    else {
                      local_9f0 = local_990->args;
                      if ((local_9f0->filter == (RTCFilterFunctionN)0x0) &&
                         (*(long *)(lVar4 + 0x48) == 0)) {
                        bVar32 = false;
                      }
                      else {
                        h.u = *(float *)(local_838 + uVar42 * 4);
                        h.v = *(float *)(local_828 + uVar42 * 4);
                        args.context = local_990->user;
                        h.primID = *(uint *)(lVar41 + uVar34 + 0x130 + uVar42 * 4);
                        h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_808 + uVar42 * 4);
                        h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_7f8 + uVar42 * 4);
                        h.Ng.field_0.field_0.z = *(float *)((long)&local_7e8 + uVar42 * 4);
                        h.instID[0] = (args.context)->instID[0];
                        h.instPrimID[0] = (args.context)->instPrimID[0];
                        local_a28._0_4_ = ray->tfar;
                        ray->tfar = local_818[uVar42];
                        local_a2c = -1;
                        args.valid = &local_a2c;
                        args.geometryUserPtr = *(void **)(lVar4 + 0x18);
                        args.hit = (RTCHitN *)&h;
                        args.N = 1;
                        args.ray = (RTCRayN *)ray;
                        if ((*(code **)(lVar4 + 0x48) == (code *)0x0) ||
                           ((**(code **)(lVar4 + 0x48))(&args), *args.valid != 0)) {
                          if (local_9f0->filter != (RTCFilterFunctionN)0x0) {
                            if (((local_9f0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                 RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               ((*(byte *)(local_a08._0_8_ + 0x3e) & 0x40) != 0)) {
                              (*local_9f0->filter)(&args);
                            }
                            if (*args.valid == 0) goto LAB_002d8ddf;
                          }
                          bVar32 = false;
                        }
                        else {
LAB_002d8ddf:
                          ray->tfar = (float)local_a28._0_4_;
                          local_a48._0_8_ = uVar40 ^ 1L << (local_a18._0_8_ & 0x3f);
                          bVar32 = true;
                        }
                      }
                    }
                    iVar36 = 0;
                    if (!bVar32) {
                      uVar40 = local_9e8;
                      uVar42 = local_9e0;
                      if (bVar43) {
                        ray->tfar = -INFINITY;
                        iVar36 = 3;
                      }
                      goto LAB_002d8e97;
                    }
                    uVar40 = local_a48._0_8_;
                  } while (local_a48._0_8_ != 0);
                }
              }
              uVar38 = uVar38 + 1;
              bVar43 = uVar38 < local_9c0;
              uVar40 = local_9e8;
              uVar42 = local_9e0;
            } while (uVar38 != local_9c0);
          }
          iVar36 = 0;
        }
LAB_002d8e97:
      } while (iVar36 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }